

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_export.cpp
# Opt level: O2

unique_ptr<duckdb::ExportStatement,_std::default_delete<duckdb::ExportStatement>,_true> __thiscall
duckdb::Transformer::TransformExport(Transformer *this,PGExportStmt *stmt)

{
  pointer pCVar1;
  type info;
  pointer pEVar2;
  long in_RDX;
  __uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_> local_30;
  
  make_uniq<duckdb::CopyInfo>();
  pCVar1 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_30);
  ::std::__cxx11::string::assign((char *)&pCVar1->file_path);
  pCVar1 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_30);
  ::std::__cxx11::string::assign((char *)&pCVar1->format);
  pCVar1 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_30);
  pCVar1->is_from = false;
  info = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                   ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                    &local_30);
  TransformCopyOptions((Transformer *)stmt,info,*(PGList **)(in_RDX + 0x18));
  make_uniq<duckdb::ExportStatement,duckdb::unique_ptr<duckdb::CopyInfo,std::default_delete<duckdb::CopyInfo>,true>>
            ((duckdb *)this,
             (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)&local_30)
  ;
  if (*(long *)(in_RDX + 8) != 0) {
    pEVar2 = unique_ptr<duckdb::ExportStatement,_std::default_delete<duckdb::ExportStatement>,_true>
             ::operator->((unique_ptr<duckdb::ExportStatement,_std::default_delete<duckdb::ExportStatement>,_true>
                           *)this);
    ::std::__cxx11::string::assign((char *)&pEVar2->database);
  }
  if (local_30._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>
                          .super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl + 8))();
  }
  return (unique_ptr<duckdb::ExportStatement,_std::default_delete<duckdb::ExportStatement>_>)
         (unique_ptr<duckdb::ExportStatement,_std::default_delete<duckdb::ExportStatement>_>)this;
}

Assistant:

unique_ptr<ExportStatement> Transformer::TransformExport(duckdb_libpgquery::PGExportStmt &stmt) {
	auto info = make_uniq<CopyInfo>();
	info->file_path = stmt.filename;
	info->format = "csv";
	info->is_from = false;
	// handle export options
	TransformCopyOptions(*info, stmt.options);

	auto result = make_uniq<ExportStatement>(std::move(info));
	if (stmt.database) {
		result->database = stmt.database;
	}
	return result;
}